

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

void __thiscall
pbrt::BilinearPatch::BilinearPatch
          (BilinearPatch *this,BilinearPatchMesh *mesh,int meshIndex,int blpIndex)

{
  Point3<float> *this_00;
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  Point3f *pPVar6;
  undefined1 auVar7 [16];
  BilinearPatch *pBVar8;
  bool bVar9;
  long lVar10;
  float *pfVar11;
  Tuple3<pbrt::Point3,_float> *t0;
  Point3<float> *pPVar12;
  Point3<float> *p_00;
  int j;
  long lVar13;
  long in_FS_OFFSET;
  type tVar14;
  type tVar15;
  float t;
  float t_00;
  undefined1 auVar16 [64];
  undefined1 auVar23 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar24 [60];
  undefined1 in_register_00001284 [12];
  Point3<float> PVar25;
  Vector3<float> VVar26;
  Tuple3<pbrt::Point3,_float> local_140;
  Tuple3<pbrt::Point3,_float> local_130;
  BilinearPatch *local_120;
  long local_118;
  float *local_110;
  Tuple3<pbrt::Vector3,_float> local_108;
  Point3f p [4] [4];
  undefined1 extraout_var [60];
  
  this->meshIndex = meshIndex;
  this->blpIndex = blpIndex;
  *(long *)(in_FS_OFFSET + -0x3b8) = *(long *)(in_FS_OFFSET + -0x3b8) + 0xc;
  piVar5 = mesh->vertexIndices;
  lVar10 = (long)(blpIndex << 2);
  pPVar6 = mesh->p;
  iVar2 = piVar5[lVar10 + 1];
  iVar3 = piVar5[lVar10 + 2];
  iVar4 = piVar5[lVar10 + 3];
  t0 = &pPVar6[piVar5[lVar10]].super_Tuple3<pbrt::Point3,_float>;
  bVar9 = IsRectangle(this,mesh);
  if (bVar9) {
    tVar14 = Distance<float>((Point3<float> *)t0,
                             (Point3<float> *)&pPVar6[iVar3].super_Tuple3<pbrt::Point3,_float>);
    tVar15 = Distance<float>((Point3<float> *)t0,
                             (Point3<float> *)&pPVar6[iVar2].super_Tuple3<pbrt::Point3,_float>);
    this->area = tVar15 * tVar14;
  }
  else {
    auVar16 = ZEXT1664(ZEXT816(0) << 0x40);
    pfVar11 = &p[0][0].super_Tuple3<pbrt::Point3,_float>.z;
    lVar10 = 0;
    local_120 = this;
    p._0_64_ = auVar16;
    p._64_64_ = auVar16;
    p._128_64_ = auVar16;
    while (pBVar8 = local_120, lVar10 != 4) {
      t = (float)(int)lVar10 / 3.0;
      auVar16 = ZEXT1664(CONCAT124(in_ZMM1._4_12_,t));
      local_118 = lVar10;
      local_110 = pfVar11;
      for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
        t_00 = (float)(int)lVar13 / 3.0;
        auVar23 = ZEXT856(in_register_00001284._4_8_);
        auVar24 = ZEXT1260(in_ZMM1._4_12_);
        PVar25 = Lerp<pbrt::Point3,float>(t_00,t0,&pPVar6[iVar3].super_Tuple3<pbrt::Point3,_float>);
        local_130.z = PVar25.super_Tuple3<pbrt::Point3,_float>.z;
        auVar17._0_8_ = PVar25.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar17._8_56_ = auVar23;
        local_130._0_8_ = vmovlps_avx(auVar17._0_16_);
        auVar23 = (undefined1  [56])0x0;
        PVar25 = Lerp<pbrt::Point3,float>
                           (t_00,&pPVar6[iVar2].super_Tuple3<pbrt::Point3,_float>,
                            &pPVar6[iVar4].super_Tuple3<pbrt::Point3,_float>);
        local_140.z = PVar25.super_Tuple3<pbrt::Point3,_float>.z;
        auVar18._0_8_ = PVar25.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar18._8_56_ = auVar23;
        local_140._0_8_ = vmovlps_avx(auVar18._0_16_);
        auVar23 = (undefined1  [56])0x0;
        PVar25 = Lerp<pbrt::Point3,float>(t,&local_130,&local_140);
        in_ZMM1._0_4_ = PVar25.super_Tuple3<pbrt::Point3,_float>.z;
        in_ZMM1._4_60_ = auVar24;
        auVar16._0_8_ = PVar25.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar16._8_56_ = auVar23;
        uVar1 = vmovlps_avx(auVar16._0_16_);
        ((Tuple3<pbrt::Point3,_float> *)(pfVar11 + -2))->x = (float)(int)uVar1;
        ((Tuple3<pbrt::Point3,_float> *)(pfVar11 + -2))->y = (float)(int)((ulong)uVar1 >> 0x20);
        *pfVar11 = in_ZMM1._0_4_;
        pfVar11 = pfVar11 + 3;
      }
      pfVar11 = local_110 + 0xc;
      lVar10 = local_118 + 1;
    }
    pPVar12 = p[0];
    lVar10 = 0;
    local_120->area = 0.0;
    while (lVar10 != 3) {
      lVar10 = lVar10 + 1;
      lVar13 = 3;
      p_00 = pPVar12;
      while (bVar9 = lVar13 != 0, lVar13 = lVar13 + -1, bVar9) {
        auVar23 = ZEXT856(auVar16._8_8_);
        VVar26 = Point3<float>::operator-(p_00 + 5,p_00);
        local_140.z = VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar19._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar19._8_56_ = auVar23;
        this_00 = p_00 + 4;
        p_00 = p_00 + 1;
        local_140._0_8_ = vmovlps_avx(auVar19._0_16_);
        VVar26 = Point3<float>::operator-(this_00,p_00);
        local_108.z = VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar20._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar20._8_56_ = auVar23;
        local_108._0_8_ = vmovlps_avx(auVar20._0_16_);
        VVar26 = Cross<float>((Vector3<float> *)&local_140,(Vector3<float> *)&local_108);
        local_130.z = VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar21._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar21._8_56_ = auVar23;
        local_130._0_8_ = vmovlps_avx(auVar21._0_16_);
        auVar22._0_4_ = Length<float>((Vector3<float> *)&local_130);
        auVar22._4_60_ = extraout_var;
        auVar7 = vfmadd213ss_fma(auVar22._0_16_,SUB6416(ZEXT464(0x3f000000),0),
                                 ZEXT416((uint)pBVar8->area));
        auVar16 = ZEXT1664(auVar7);
        pBVar8->area = auVar7._0_4_;
      }
      pPVar12 = pPVar12 + 4;
    }
  }
  return;
}

Assistant:

BilinearPatch::BilinearPatch(const BilinearPatchMesh *mesh, int meshIndex, int blpIndex)
    : meshIndex(meshIndex), blpIndex(blpIndex) {
    blpBytes += sizeof(*this);
    // Store area of bilinear patch in _area_
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];
    if (IsRectangle(mesh))
        area = Distance(p00, p01) * Distance(p00, p10);
    else {
        // Compute approximate area of bilinear patch
        // FIXME: it would be good to skip this for flat patches, or to
        // be adaptive based on curvature in some manner
        constexpr int na = 3;
        Point3f p[na + 1][na + 1];
        for (int i = 0; i <= na; ++i) {
            Float u = Float(i) / Float(na);
            for (int j = 0; j <= na; ++j) {
                Float v = Float(j) / Float(na);
                p[i][j] = Lerp(u, Lerp(v, p00, p01), Lerp(v, p10, p11));
            }
        }
        area = 0;
        for (int i = 0; i < na; ++i)
            for (int j = 0; j < na; ++j)
                area += 0.5f * Length(Cross(p[i + 1][j + 1] - p[i][j],
                                            p[i + 1][j] - p[i][j + 1]));
    }
}